

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_parse.c
# Opt level: O2

ares_status_t
ares_dns_parse_rr(ares_buf_t *buf,uint flags,ares_dns_section_t sect,ares_dns_record_t *dnsrec)

{
  unsigned_short *puVar1;
  ares_dns_rec_type_t type;
  ares_dns_rec_type_t type_00;
  unsigned_short uVar2;
  unsigned_short uVar3;
  ares_status_t aVar4;
  ares_bool_t aVar5;
  uint uVar6;
  ares_status_t aVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  ares_dns_rr_key_t key;
  ares_dns_rr_key_t aVar11;
  char *pcVar12;
  ulong uVar13;
  ares_dns_rr_t *paVar14;
  ares_status_t aVar15;
  ares_dns_class_t rclass;
  unsigned_short len;
  unsigned_short opt;
  ulong local_78;
  unsigned_short u16;
  ares_dns_multistring_t *strs;
  ares_dns_class_t local_54;
  ares_dns_rec_type_t local_50;
  uint ttl;
  ares_dns_rr_t *rr;
  char *name;
  size_t local_38;
  
  name = (char *)0x0;
  rr = (ares_dns_rr_t *)0x0;
  aVar4 = ares_dns_name_parse(buf,&name,ARES_FALSE);
  if (((aVar4 != ARES_SUCCESS) ||
      (aVar4 = ares_buf_fetch_be16(buf,&u16), uVar2 = u16, aVar4 != ARES_SUCCESS)) ||
     (aVar4 = ares_buf_fetch_be16(buf,&u16), uVar3 = u16, aVar4 != ARES_SUCCESS))
  goto switchD_0011fb08_caseD_3;
  local_50 = (ares_dns_rec_type_t)uVar2;
  aVar4 = ares_buf_fetch_be32(buf,&ttl);
  if (aVar4 != ARES_SUCCESS) goto switchD_0011fb08_caseD_3;
  local_54 = (ares_dns_class_t)uVar3;
  aVar4 = ares_buf_fetch_be16(buf,&u16);
  type = local_50;
  if (aVar4 != ARES_SUCCESS) goto switchD_0011fb08_caseD_3;
  local_78 = (ulong)u16;
  aVar5 = ares_dns_rec_type_isvalid(local_50,ARES_FALSE);
  if (aVar5 == ARES_FALSE) {
    type = ARES_REC_TYPE_RAW_RR;
  }
  aVar5 = ares_dns_rec_allow_name_comp(type);
  if (sect == ARES_SECTION_ADDITIONAL) {
    uVar6 = 4;
    if (aVar5 == ARES_FALSE) {
      uVar6 = 0x20;
    }
LAB_0011f9a3:
    type_00 = ARES_REC_TYPE_RAW_RR;
    if ((uVar6 & flags) == 0) {
      type_00 = type;
    }
  }
  else {
    if (sect == ARES_SECTION_AUTHORITY) {
      uVar6 = 0x10;
      if (aVar5 != ARES_FALSE) {
        uVar6 = 2;
      }
      goto LAB_0011f9a3;
    }
    type_00 = type;
    if (sect == ARES_SECTION_ANSWER) {
      uVar6 = 8;
      if (aVar5 != ARES_FALSE) {
        uVar6 = 1;
      }
      goto LAB_0011f9a3;
    }
  }
  sVar8 = ares_buf_len(buf);
  aVar15 = ARES_EBADRESP;
  aVar4 = aVar15;
  if (sVar8 < local_78) goto switchD_0011fb08_caseD_3;
  uVar6 = 0;
  rclass = ARES_CLASS_IN;
  if (type_00 != ARES_REC_TYPE_OPT) {
    uVar6 = ttl;
    rclass = local_54;
  }
  pcVar12 = name;
  aVar4 = ares_dns_record_rr_add(&rr,dnsrec,sect,name,type_00,rclass,uVar6);
  aVar11 = (ares_dns_rr_key_t)pcVar12;
  if (aVar4 != ARES_SUCCESS) goto switchD_0011fb08_caseD_3;
  local_38 = ares_buf_len(buf);
  paVar14 = rr;
  aVar5 = (ares_bool_t)rr;
  key = 0x1280d0;
  aVar4 = ARES_EFORMERR;
  switch(type_00) {
  case ARES_REC_TYPE_A:
    aVar4 = ares_buf_fetch_bytes(buf,(uchar *)&strs,4);
    if (aVar4 == ARES_SUCCESS) {
      aVar4 = ares_dns_rr_set_addr(paVar14,ARES_RR_A_ADDR,(in_addr *)&strs);
    }
    break;
  case ARES_REC_TYPE_NS:
    paVar14 = (ares_dns_rr_t *)0xc9;
    goto LAB_0011fcf6;
  case ARES_REC_TYPE_NS|ARES_REC_TYPE_A:
  case 4:
  case ARES_REC_TYPE_SOA|ARES_REC_TYPE_A:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case ARES_REC_TYPE_PTR|ARES_REC_TYPE_NS:
    goto switchD_0011fb08_caseD_3;
  case ARES_REC_TYPE_CNAME:
    paVar14 = (ares_dns_rr_t *)0x1f5;
    goto LAB_0011fcf6;
  case ARES_REC_TYPE_SOA:
    aVar4 = ares_dns_parse_and_set_dns_name(buf,aVar5,(ares_dns_rr_t *)0x259,0x1280d0);
    if (((((aVar4 != ARES_SUCCESS) ||
          (aVar4 = ares_dns_parse_and_set_dns_name(buf,aVar5,(ares_dns_rr_t *)0x25a,key),
          aVar4 != ARES_SUCCESS)) ||
         (aVar4 = ares_dns_parse_and_set_be32(buf,paVar14,ARES_RR_SOA_SERIAL), aVar4 != ARES_SUCCESS
         )) || ((aVar4 = ares_dns_parse_and_set_be32(buf,paVar14,ARES_RR_SOA_REFRESH),
                aVar4 != ARES_SUCCESS ||
                (aVar4 = ares_dns_parse_and_set_be32(buf,paVar14,ARES_RR_SOA_RETRY),
                aVar4 != ARES_SUCCESS)))) ||
       (aVar4 = ares_dns_parse_and_set_be32(buf,paVar14,ARES_RR_SOA_EXPIRE), aVar4 != ARES_SUCCESS))
    goto switchD_0011fb08_caseD_3;
    aVar4 = ares_dns_parse_and_set_be32(buf,paVar14,ARES_RR_SOA_MINIMUM);
    break;
  case ARES_REC_TYPE_PTR:
    paVar14 = (ares_dns_rr_t *)0x4b1;
    goto LAB_0011fcf6;
  case ARES_REC_TYPE_HINFO:
    sVar10 = ares_buf_len(buf);
    sVar9 = ares_buf_len(buf);
    sVar8 = 0;
    if (sVar10 - sVar9 <= local_78) {
      sVar8 = local_78 - (sVar10 - sVar9);
    }
    aVar4 = ares_dns_parse_and_set_dns_str(buf,sVar8,paVar14,ARES_RR_HINFO_CPU,ARES_TRUE);
    if (aVar4 != ARES_SUCCESS) goto switchD_0011fb08_caseD_3;
    sVar9 = ares_buf_len(buf);
    sVar8 = 0;
    if (sVar10 - sVar9 <= local_78) {
      sVar8 = local_78 - (sVar10 - sVar9);
    }
    aVar4 = ares_dns_parse_and_set_dns_str(buf,sVar8,paVar14,ARES_RR_HINFO_OS,ARES_TRUE);
    break;
  case ARES_REC_TYPE_MX:
    key = 0x1280d0;
    aVar4 = ares_dns_parse_and_set_be16(buf,rr,ARES_RR_MX_PREFERENCE);
    if (aVar4 != ARES_SUCCESS) goto switchD_0011fb08_caseD_3;
    paVar14 = (ares_dns_rr_t *)0x5de;
LAB_0011fcf6:
    aVar4 = ares_dns_parse_and_set_dns_name(buf,aVar5,paVar14,key);
    break;
  case ARES_REC_TYPE_TXT:
    strs = (ares_dns_multistring_t *)0x0;
    aVar4 = ares_dns_multistring_parse_buf(buf,local_78,&strs,ARES_FALSE);
    if (aVar4 == ARES_SUCCESS) {
      aVar7 = ares_dns_rr_set_abin_own(paVar14,ARES_RR_TXT_DATA,strs);
      aVar4 = ARES_SUCCESS;
      if (aVar7 != ARES_SUCCESS) {
        ares_dns_multistring_destroy(strs);
        aVar4 = aVar7;
      }
    }
    break;
  default:
    if (type_00 == ARES_REC_TYPE_SIG) {
      sVar8 = ares_buf_len(buf);
      aVar4 = ares_dns_parse_and_set_be16(buf,paVar14,ARES_RR_SIG_TYPE_COVERED);
      if ((((aVar4 == ARES_SUCCESS) &&
           (aVar4 = ares_dns_parse_and_set_u8(buf,paVar14,ARES_RR_SIG_ALGORITHM),
           aVar4 == ARES_SUCCESS)) &&
          ((aVar4 = ares_dns_parse_and_set_u8(buf,paVar14,ARES_RR_SIG_LABELS), aVar4 == ARES_SUCCESS
           && ((aVar4 = ares_dns_parse_and_set_be32(buf,paVar14,ARES_RR_SIG_ORIGINAL_TTL),
               aVar4 == ARES_SUCCESS &&
               (aVar4 = ares_dns_parse_and_set_be32(buf,paVar14,ARES_RR_SIG_EXPIRATION),
               aVar4 == ARES_SUCCESS)))))) &&
         ((aVar4 = ares_dns_parse_and_set_be32(buf,paVar14,ARES_RR_SIG_INCEPTION),
          aVar4 == ARES_SUCCESS &&
          ((aVar4 = ares_dns_parse_and_set_be16(buf,paVar14,ARES_RR_SIG_KEY_TAG),
           aVar4 == ARES_SUCCESS &&
           (aVar4 = ares_dns_parse_and_set_dns_name(buf,aVar5,(ares_dns_rr_t *)0x968,aVar11),
           aVar4 == ARES_SUCCESS)))))) {
        sVar10 = ares_buf_len(buf);
        uVar13 = sVar8 - sVar10;
        sVar8 = 0;
        if (local_78 >= uVar13) {
          sVar8 = local_78 - uVar13;
        }
        if (local_78 < uVar13 || local_78 - uVar13 == 0) goto LAB_001204da;
        aVar4 = ares_buf_fetch_bytes_dup(buf,sVar8,ARES_FALSE,(uchar **)&strs);
        if (aVar4 == ARES_SUCCESS) {
          aVar11 = ARES_RR_SIG_SIGNATURE;
LAB_00120178:
          aVar7 = ares_dns_rr_set_bin_own(paVar14,aVar11,(uchar *)strs,sVar8);
          aVar4 = ARES_SUCCESS;
          if (aVar7 != ARES_SUCCESS) {
            ares_free(strs);
            aVar4 = aVar7;
          }
        }
      }
    }
    else {
      if (type_00 != ARES_REC_TYPE_AAAA) {
        if (type_00 == ARES_REC_TYPE_SRV) {
          key = aVar11;
          aVar4 = ares_dns_parse_and_set_be16(buf,rr,ARES_RR_SRV_PRIORITY);
          if (((aVar4 != ARES_SUCCESS) ||
              (aVar4 = ares_dns_parse_and_set_be16(buf,paVar14,ARES_RR_SRV_WEIGHT),
              aVar4 != ARES_SUCCESS)) ||
             (aVar4 = ares_dns_parse_and_set_be16(buf,paVar14,ARES_RR_SRV_PORT),
             aVar4 != ARES_SUCCESS)) goto switchD_0011fb08_caseD_3;
          paVar14 = (ares_dns_rr_t *)0xce9;
        }
        else {
          if (type_00 != ARES_REC_TYPE_NAPTR) {
            if (type_00 == ARES_REC_TYPE_OPT) {
              sVar8 = ares_buf_len(buf);
              aVar4 = ares_dns_rr_set_u16(paVar14,ARES_RR_OPT_UDP_SIZE,(unsigned_short)local_54);
              if (aVar4 == ARES_SUCCESS) {
                puVar1 = &paVar14->parent->raw_rcode;
                *puVar1 = *puVar1 | (ushort)(ttl >> 0x14) & 0xfff0;
                aVar4 = ares_dns_rr_set_u8(paVar14,ARES_RR_OPT_VERSION,(uchar)(ttl >> 0x10));
                if ((aVar4 == ARES_SUCCESS) &&
                   (aVar4 = ares_dns_rr_set_u16(paVar14,ARES_RR_OPT_FLAGS,(unsigned_short)ttl),
                   aVar4 == ARES_SUCCESS)) {
                  do {
                    sVar10 = ares_buf_len(buf);
                    if (local_78 <= sVar8 - sVar10) goto LAB_0011fd05;
                    opt = 0;
                    len = 0;
                    strs = (ares_dns_multistring_t *)0x0;
                    aVar4 = ares_buf_fetch_be16(buf,&opt);
                    if ((aVar4 != ARES_SUCCESS) ||
                       (aVar4 = ares_buf_fetch_be16(buf,&len), aVar4 != ARES_SUCCESS)) break;
                    if ((ulong)len == 0) {
                      sVar10 = 0;
                    }
                    else {
                      aVar4 = ares_buf_fetch_bytes_dup(buf,(ulong)len,ARES_TRUE,(uchar **)&strs);
                      if (aVar4 != ARES_SUCCESS) break;
                      sVar10 = (size_t)len;
                    }
                    aVar4 = ares_dns_rr_set_opt_own
                                      (paVar14,ARES_RR_OPT_OPTIONS,opt,(uchar *)strs,sVar10);
                  } while (aVar4 == ARES_SUCCESS);
                }
              }
              goto switchD_0011fb08_caseD_3;
            }
            if (type_00 == ARES_REC_TYPE_TLSA) {
              sVar8 = ares_buf_len(buf);
              aVar4 = ares_dns_parse_and_set_u8(buf,paVar14,ARES_RR_TLSA_CERT_USAGE);
              if (((aVar4 == ARES_SUCCESS) &&
                  (aVar4 = ares_dns_parse_and_set_u8(buf,paVar14,ARES_RR_TLSA_SELECTOR),
                  aVar4 == ARES_SUCCESS)) &&
                 (aVar4 = ares_dns_parse_and_set_u8(buf,paVar14,ARES_RR_TLSA_MATCH),
                 aVar4 == ARES_SUCCESS)) {
                sVar10 = ares_buf_len(buf);
                uVar13 = sVar8 - sVar10;
                sVar8 = 0;
                if (local_78 >= uVar13) {
                  sVar8 = local_78 - uVar13;
                }
                if (local_78 < uVar13 || local_78 - uVar13 == 0) goto LAB_001204da;
                aVar4 = ares_buf_fetch_bytes_dup(buf,sVar8,ARES_FALSE,(uchar **)&strs);
                if (aVar4 == ARES_SUCCESS) {
                  aVar11 = ARES_RR_TLSA_DATA;
                  goto LAB_00120178;
                }
              }
            }
            else {
              if (type_00 == ARES_REC_TYPE_SVCB) {
                sVar8 = ares_buf_len(buf);
                aVar4 = ares_dns_parse_and_set_be16(buf,paVar14,ARES_RR_SVCB_PRIORITY);
                if ((aVar4 == ARES_SUCCESS) &&
                   (aVar4 = ares_dns_parse_and_set_dns_name
                                      (buf,aVar5,(ares_dns_rr_t *)0x1902,aVar11),
                   aVar4 == ARES_SUCCESS)) {
                  do {
                    sVar10 = ares_buf_len(buf);
                    if (local_78 <= sVar8 - sVar10) goto LAB_0011fd05;
                    opt = 0;
                    len = 0;
                    strs = (ares_dns_multistring_t *)0x0;
                    aVar4 = ares_buf_fetch_be16(buf,&opt);
                    if ((aVar4 != ARES_SUCCESS) ||
                       (aVar4 = ares_buf_fetch_be16(buf,&len), aVar4 != ARES_SUCCESS)) break;
                    if ((ulong)len == 0) {
                      sVar10 = 0;
                    }
                    else {
                      aVar4 = ares_buf_fetch_bytes_dup(buf,(ulong)len,ARES_TRUE,(uchar **)&strs);
                      if (aVar4 != ARES_SUCCESS) break;
                      sVar10 = (size_t)len;
                    }
                    aVar4 = ares_dns_rr_set_opt_own
                                      (paVar14,ARES_RR_SVCB_PARAMS,opt,(uchar *)strs,sVar10);
                  } while (aVar4 == ARES_SUCCESS);
                }
                goto switchD_0011fb08_caseD_3;
              }
              if (type_00 == ARES_REC_TYPE_HTTPS) {
                sVar8 = ares_buf_len(buf);
                aVar4 = ares_dns_parse_and_set_be16(buf,paVar14,ARES_RR_HTTPS_PRIORITY);
                if ((aVar4 == ARES_SUCCESS) &&
                   (aVar4 = ares_dns_parse_and_set_dns_name
                                      (buf,aVar5,(ares_dns_rr_t *)0x1966,aVar11),
                   aVar4 == ARES_SUCCESS)) {
                  do {
                    sVar10 = ares_buf_len(buf);
                    if (local_78 <= sVar8 - sVar10) goto LAB_0011fd05;
                    opt = 0;
                    len = 0;
                    strs = (ares_dns_multistring_t *)0x0;
                    aVar4 = ares_buf_fetch_be16(buf,&opt);
                    if ((aVar4 != ARES_SUCCESS) ||
                       (aVar4 = ares_buf_fetch_be16(buf,&len), aVar4 != ARES_SUCCESS)) break;
                    if ((ulong)len == 0) {
                      sVar10 = 0;
                    }
                    else {
                      aVar4 = ares_buf_fetch_bytes_dup(buf,(ulong)len,ARES_TRUE,(uchar **)&strs);
                      if (aVar4 != ARES_SUCCESS) break;
                      sVar10 = (size_t)len;
                    }
                    aVar4 = ares_dns_rr_set_opt_own
                                      (paVar14,ARES_RR_HTTPS_PARAMS,opt,(uchar *)strs,sVar10);
                  } while (aVar4 == ARES_SUCCESS);
                }
                goto switchD_0011fb08_caseD_3;
              }
              aVar4 = aVar15;
              if (type_00 == ARES_REC_TYPE_ANY) goto switchD_0011fb08_caseD_3;
              if (type_00 == ARES_REC_TYPE_URI) {
                strs = (ares_dns_multistring_t *)0x0;
                sVar8 = ares_buf_len(buf);
                aVar4 = ares_dns_parse_and_set_be16(buf,paVar14,ARES_RR_URI_PRIORITY);
                if ((aVar4 == ARES_SUCCESS) &&
                   (aVar4 = ares_dns_parse_and_set_be16(buf,paVar14,ARES_RR_URI_WEIGHT),
                   aVar4 == ARES_SUCCESS)) {
                  sVar10 = ares_buf_len(buf);
                  uVar13 = sVar8 - sVar10;
                  sVar8 = 0;
                  if (local_78 >= uVar13) {
                    sVar8 = local_78 - uVar13;
                  }
                  if (local_78 < uVar13 || local_78 - uVar13 == 0) {
LAB_001204da:
                    aVar4 = ARES_EBADRESP;
                  }
                  else {
                    aVar4 = ares_buf_fetch_str_dup(buf,sVar8,(char **)&strs);
                    if (aVar4 == ARES_SUCCESS) {
                      aVar5 = ares_str_isprint((char *)strs,sVar8);
                      if (aVar5 == ARES_FALSE) {
                        aVar4 = ARES_EBADRESP;
                      }
                      else {
                        aVar4 = ares_dns_rr_set_str_own(paVar14,ARES_RR_URI_TARGET,(char *)strs);
LAB_001204f4:
                        if (aVar4 == ARES_SUCCESS) goto LAB_0012050c;
                      }
LAB_00120502:
                      ares_free(strs);
                    }
                  }
                }
              }
              else if (type_00 == ARES_REC_TYPE_CAA) {
                strs = (ares_dns_multistring_t *)0x0;
                sVar8 = ares_buf_len(buf);
                aVar4 = ares_dns_parse_and_set_u8(buf,paVar14,ARES_RR_CAA_CRITICAL);
                if (aVar4 == ARES_SUCCESS) {
                  sVar9 = ares_buf_len(buf);
                  sVar10 = 0;
                  if (sVar8 - sVar9 <= local_78) {
                    sVar10 = local_78 - (sVar8 - sVar9);
                  }
                  aVar4 = ares_dns_parse_and_set_dns_str
                                    (buf,sVar10,paVar14,ARES_RR_CAA_TAG,ARES_FALSE);
                  if (aVar4 == ARES_SUCCESS) {
                    sVar10 = ares_buf_len(buf);
                    uVar13 = sVar8 - sVar10;
                    sVar8 = 0;
                    if (local_78 >= uVar13) {
                      sVar8 = local_78 - uVar13;
                    }
                    if (local_78 < uVar13 || local_78 - uVar13 == 0) goto LAB_001204da;
                    aVar4 = ares_buf_fetch_bytes_dup(buf,sVar8,ARES_TRUE,(uchar **)&strs);
                    if (aVar4 == ARES_SUCCESS) {
                      aVar4 = ares_dns_rr_set_bin_own(paVar14,ARES_RR_CAA_VALUE,(uchar *)strs,sVar8)
                      ;
                      if (aVar4 != ARES_SUCCESS) goto LAB_00120502;
                      goto LAB_0012050c;
                    }
                  }
                }
              }
              else {
                aVar4 = ARES_EFORMERR;
                if (type_00 != ARES_REC_TYPE_RAW_RR) goto switchD_0011fb08_caseD_3;
                strs = (ares_dns_multistring_t *)0x0;
                if (local_78 == 0) {
LAB_0012050c:
                  aVar4 = ARES_SUCCESS;
                }
                else {
                  aVar4 = ares_buf_fetch_bytes_dup(buf,local_78,ARES_FALSE,(uchar **)&strs);
                  if (aVar4 == ARES_SUCCESS) {
                    aVar4 = ares_dns_rr_set_u16(paVar14,ARES_RR_RAW_RR_TYPE,(unsigned_short)local_50
                                               );
                    if (aVar4 == ARES_SUCCESS) {
                      aVar4 = ares_dns_rr_set_bin_own
                                        (paVar14,ARES_RR_RAW_RR_DATA,(uchar *)strs,local_78);
                      goto LAB_001204f4;
                    }
                    goto LAB_00120502;
                  }
                }
              }
            }
            break;
          }
          sVar8 = ares_buf_len(buf);
          aVar4 = ares_dns_parse_and_set_be16(buf,paVar14,ARES_RR_NAPTR_ORDER);
          if ((aVar4 != ARES_SUCCESS) ||
             (aVar4 = ares_dns_parse_and_set_be16(buf,paVar14,ARES_RR_NAPTR_PREFERENCE),
             aVar4 != ARES_SUCCESS)) goto switchD_0011fb08_caseD_3;
          sVar9 = ares_buf_len(buf);
          sVar10 = 0;
          if (sVar8 - sVar9 <= local_78) {
            sVar10 = local_78 - (sVar8 - sVar9);
          }
          aVar4 = ares_dns_parse_and_set_dns_str(buf,sVar10,paVar14,ARES_RR_NAPTR_FLAGS,ARES_TRUE);
          if (aVar4 != ARES_SUCCESS) goto switchD_0011fb08_caseD_3;
          sVar9 = ares_buf_len(buf);
          sVar10 = 0;
          if (sVar8 - sVar9 <= local_78) {
            sVar10 = local_78 - (sVar8 - sVar9);
          }
          aVar4 = ares_dns_parse_and_set_dns_str
                            (buf,sVar10,paVar14,ARES_RR_NAPTR_SERVICES,ARES_TRUE);
          if (aVar4 != ARES_SUCCESS) goto switchD_0011fb08_caseD_3;
          sVar9 = ares_buf_len(buf);
          sVar10 = 0;
          if (sVar8 - sVar9 <= local_78) {
            sVar10 = local_78 - (sVar8 - sVar9);
          }
          key = ARES_RR_NAPTR_REGEXP;
          aVar4 = ares_dns_parse_and_set_dns_str(buf,sVar10,paVar14,ARES_RR_NAPTR_REGEXP,ARES_TRUE);
          if (aVar4 != ARES_SUCCESS) goto switchD_0011fb08_caseD_3;
          paVar14 = (ares_dns_rr_t *)0xdb2;
        }
        goto LAB_0011fcf6;
      }
      aVar4 = ares_buf_fetch_bytes(buf,(uchar *)&strs,0x10);
      if (aVar4 == ARES_SUCCESS) {
        aVar4 = ares_dns_rr_set_addr6(paVar14,ARES_RR_AAAA_ADDR,(ares_in6_addr *)&strs);
      }
    }
  }
  if (aVar4 == ARES_SUCCESS) {
LAB_0011fd05:
    sVar8 = ares_buf_len(buf);
    uVar13 = local_38 - sVar8;
    aVar4 = aVar15;
    if (uVar13 <= local_78) {
      aVar4 = ARES_SUCCESS;
      if (uVar13 <= local_78 && local_78 - uVar13 != 0) {
        ares_buf_consume(buf,local_78 - uVar13);
      }
    }
  }
switchD_0011fb08_caseD_3:
  ares_free(name);
  return aVar4;
}

Assistant:

static ares_status_t ares_dns_parse_rr(ares_buf_t *buf, unsigned int flags,
                                       ares_dns_section_t sect,
                                       ares_dns_record_t *dnsrec)
{
  char               *name = NULL;
  unsigned short      u16;
  unsigned short      raw_type;
  ares_status_t       status;
  ares_dns_rec_type_t type;
  ares_dns_class_t    qclass;
  unsigned int        ttl;
  size_t              rdlength;
  ares_dns_rr_t      *rr            = NULL;
  size_t              remaining_len = 0;
  size_t              processed_len = 0;
  ares_bool_t         namecomp;

  /* All RRs have the same top level format shown below:
   *                                 1  1  1  1  1  1
   *   0  1  2  3  4  5  6  7  8  9  0  1  2  3  4  5
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                                               |
   * /                                               /
   * /                      NAME                     /
   * |                                               |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                      TYPE                     |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                     CLASS                     |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                      TTL                      |
   * |                                               |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   * |                   RDLENGTH                    |
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--|
   * /                     RDATA                     /
   * /                                               /
   * +--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+--+
   */

  /* Name */
  status = ares_dns_name_parse(buf, &name, ARES_FALSE);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Type */
  status = ares_buf_fetch_be16(buf, &u16);
  if (status != ARES_SUCCESS) {
    goto done;
  }
  type     = u16;
  raw_type = u16; /* Only used for raw rr data */

  /* Class */
  status = ares_buf_fetch_be16(buf, &u16);
  if (status != ARES_SUCCESS) {
    goto done;
  }
  qclass = u16;

  /* TTL */
  status = ares_buf_fetch_be32(buf, &ttl);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Length */
  status = ares_buf_fetch_be16(buf, &u16);
  if (status != ARES_SUCCESS) {
    goto done;
  }
  rdlength = u16;

  if (!ares_dns_rec_type_isvalid(type, ARES_FALSE)) {
    type = ARES_REC_TYPE_RAW_RR;
  }

  namecomp = ares_dns_rec_allow_name_comp(type);
  if (sect == ARES_SECTION_ANSWER &&
      (flags &
       (namecomp ? ARES_DNS_PARSE_AN_BASE_RAW : ARES_DNS_PARSE_AN_EXT_RAW))) {
    type = ARES_REC_TYPE_RAW_RR;
  }
  if (sect == ARES_SECTION_AUTHORITY &&
      (flags &
       (namecomp ? ARES_DNS_PARSE_NS_BASE_RAW : ARES_DNS_PARSE_NS_EXT_RAW))) {
    type = ARES_REC_TYPE_RAW_RR;
  }
  if (sect == ARES_SECTION_ADDITIONAL &&
      (flags &
       (namecomp ? ARES_DNS_PARSE_AR_BASE_RAW : ARES_DNS_PARSE_AR_EXT_RAW))) {
    type = ARES_REC_TYPE_RAW_RR;
  }

  /* Pull into another buffer for safety */
  if (rdlength > ares_buf_len(buf)) {
    status = ARES_EBADRESP;
    goto done;
  }

  /* Add the base rr */
  status =
    ares_dns_record_rr_add(&rr, dnsrec, sect, name, type,
                           type == ARES_REC_TYPE_OPT ? ARES_CLASS_IN : qclass,
                           type == ARES_REC_TYPE_OPT ? 0 : ttl);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Record the current remaining length in the buffer so we can tell how
   * much was processed */
  remaining_len = ares_buf_len(buf);

  /* Fill in the data for the rr */
  status = ares_dns_parse_rr_data(buf, rdlength, rr, type, raw_type,
                                  (unsigned short)qclass, ttl);
  if (status != ARES_SUCCESS) {
    goto done;
  }

  /* Determine how many bytes were processed */
  processed_len = remaining_len - ares_buf_len(buf);

  /* If too many bytes were processed, error! */
  if (processed_len > rdlength) {
    status = ARES_EBADRESP;
    goto done;
  }

  /* If too few bytes were processed, consume the unprocessed data for this
   * record as the parser may not have wanted/needed to use it */
  if (processed_len < rdlength) {
    ares_buf_consume(buf, rdlength - processed_len);
  }


done:
  ares_free(name);
  return status;
}